

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

string * __thiscall
program_options::error_with_option_name::get_canonical_option_name_abi_cxx11_
          (string *__return_storage_ptr__,error_with_option_name *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  int iVar1;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  string option_name;
  string original_token;
  allocator<char> local_81;
  key_type local_80;
  key_type local_60;
  key_type local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"option",(allocator<char> *)&local_80);
  this_00 = &this->m_substitutions;
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_40);
  p_Var2 = cVar3._M_node[2]._M_parent;
  std::__cxx11::string::~string((string *)&local_40);
  if (p_Var2 == (_Base_ptr)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"original_token",(allocator<char> *)&local_80);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_40);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(cVar3._M_node + 2));
    goto LAB_00113d23;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"original_token",(allocator<char> *)&local_60);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_80);
  strip_prefixes(&local_40,(string *)(cVar3._M_node + 2));
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"option",&local_81);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_60);
  strip_prefixes(&local_80,(string *)(cVar3._M_node + 2));
  std::__cxx11::string::~string((string *)&local_60);
  iVar1 = this->m_option_style;
  if (iVar1 == 0) {
LAB_00113cd7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_80.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_80._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    if ((iVar1 == 0x1000) || (iVar1 == 1)) {
      get_canonical_option_prefix_abi_cxx11_(&local_60,this);
      std::operator+(__return_storage_ptr__,&local_60,&local_80);
    }
    else {
      if (local_40._M_string_length == 0) goto LAB_00113cd7;
      get_canonical_option_prefix_abi_cxx11_(&local_60,this);
      std::operator+(__return_storage_ptr__,&local_60,*local_40._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_80);
LAB_00113d23:
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string error_with_option_name::get_canonical_option_name() const
{
    if (!m_substitutions.find("option")->second.length())
        return m_substitutions.find("original_token")->second;

    std::string original_token   = strip_prefixes(m_substitutions.find("original_token")->second);
    std::string option_name      = strip_prefixes(m_substitutions.find("option")->second);

    //  For long options, use option name
    if (m_option_style == command_line_style::allow_long        ||
         m_option_style == command_line_style::allow_long_disguise)
        return get_canonical_option_prefix() + option_name;

    //  For short options use first letter of original_token
    if (m_option_style && original_token.length())
        return get_canonical_option_prefix() + original_token[0];

    // no prefix
    return option_name;
}